

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O3

void Imath_3_2::extractEulerZYX<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec3<float> local_98;
  Vec3<float> local_88;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  undefined1 local_68 [12];
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  Vec3<float> local_20;
  
  local_88.z = mat->x[0][2];
  uVar7 = 0;
  local_88._0_8_ = *(undefined8 *)mat->x[0];
  local_98.z = mat->x[1][2];
  local_98._0_8_ = *(undefined8 *)mat->x[1];
  fVar6 = mat->x[2][2];
  uVar1._0_4_ = *(float *)((long)(mat->x + 2) + 0);
  uVar1._4_4_ = *(float *)((long)(mat->x + 2) + 4);
  fVar5 = (float)((ulong)local_88._0_8_ >> 0x20);
  fVar5 = local_88.z * local_88.z + (float)local_88._0_8_ * (float)local_88._0_8_ + fVar5 * fVar5;
  local_20._0_8_ = uVar1;
  local_20.z = fVar6;
  if (fVar5 < 2.3509887e-38) {
    stack0xffffffffffffffa0 = 0;
    uStack_40 = 0;
    local_68._0_8_ = uVar1;
    local_48 = local_98._0_8_;
    local_38 = local_98.z;
    fVar5 = Vec3<float>::lengthTiny(&local_88);
    uVar7 = extraout_XMM0_Db_00;
    uVar1._0_4_ = (float)local_68._0_4_;
    uVar1._4_4_ = (float)local_68._4_4_;
    uStack_30 = local_68._8_4_;
    uStack_2c = uStack_5c;
    fVar9 = local_38;
    fVar13 = (float)local_48;
    fVar8 = local_48._4_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
    uStack_30 = 0;
    uStack_2c = 0;
    fVar9 = local_98.z;
    fVar13 = (float)local_98._0_8_;
    fVar8 = (float)((ulong)local_98._0_8_ >> 0x20);
  }
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    auVar10._8_8_ = 0;
    auVar10._0_4_ = local_88.x;
    auVar10._4_4_ = local_88.y;
    auVar11._4_4_ = fVar5;
    auVar11._0_4_ = fVar5;
    auVar11._8_4_ = uVar7;
    auVar11._12_4_ = uVar7;
    auVar11 = divps(auVar10,auVar11);
    local_88._0_8_ = auVar11._0_8_;
    local_88.z = local_88.z / fVar5;
  }
  fVar8 = fVar8 * fVar8;
  fVar5 = fVar9 * fVar9 + fVar13 * fVar13 + fVar8;
  if (fVar5 < 2.3509887e-38) {
    local_68._4_4_ = uVar1._4_4_;
    local_68._0_4_ = (float)uVar1;
    stack0xffffffffffffffa0 = CONCAT44(uStack_2c,uStack_30);
    fVar5 = Vec3<float>::lengthTiny(&local_98);
    fVar8 = extraout_XMM0_Db_01;
    uVar1._0_4_ = (float)local_68._0_4_;
    fStack_34 = (float)local_68._4_4_;
    uStack_30 = local_68._8_4_;
    uStack_2c = uStack_5c;
  }
  else {
    fVar5 = SQRT(fVar5);
    fStack_34 = uVar1._4_4_;
  }
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    auVar12._8_8_ = 0;
    auVar12._0_4_ = local_98.x;
    auVar12._4_4_ = local_98.y;
    auVar4._4_4_ = fVar5;
    auVar4._0_4_ = fVar5;
    auVar4._8_4_ = fVar8;
    auVar4._12_4_ = fVar8;
    auVar11 = divps(auVar12,auVar4);
    local_98._0_8_ = auVar11._0_8_;
    local_98.z = local_98.z / fVar5;
  }
  uVar1._4_4_ = fVar6 * fVar6 + (float)uVar1 * (float)uVar1 + fStack_34 * fStack_34;
  if (uVar1._4_4_ < 2.3509887e-38) {
    uVar1._4_4_ = Vec3<float>::lengthTiny(&local_20);
    uStack_30 = 0;
    uStack_2c = 0;
    fStack_34 = 0.0;
    fVar6 = local_20.z;
    uVar1._0_4_ = local_20.x;
    fVar5 = local_20.y;
  }
  else {
    uVar1._4_4_ = SQRT(uVar1._4_4_);
    fVar5 = fStack_34;
  }
  bVar2 = NAN(uVar1._4_4_);
  bVar3 = uVar1._4_4_ == 0.0;
  fVar8 = fVar6 / uVar1._4_4_;
  if ((bVar3) && (!bVar2)) {
    fVar8 = fVar6;
  }
  fVar6 = fVar5 / uVar1._4_4_;
  if ((bVar3) && (!bVar2)) {
    fVar6 = fVar5;
  }
  local_68._0_4_ = fVar8;
  local_38 = (float)uVar1 / uVar1._4_4_;
  if ((bVar3) && (!bVar2)) {
    local_38 = (float)uVar1;
  }
  local_48 = CONCAT44(local_48._4_4_,local_88.x);
  local_78 = local_88.y;
  local_70 = local_88.z;
  local_6c = local_98.x;
  local_7c = local_98.y;
  local_74 = local_98.z;
  local_58._0_4_ = atan2f(local_98.x,local_88.x);
  local_58._4_4_ = extraout_XMM0_Db;
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._12_4_ = extraout_XMM0_Dd;
  rot->x = -(float)local_58._0_4_;
  uVar1._0_4_ = cosf((float)local_58._0_4_);
  uVar1._4_4_ = sinf((float)local_58._0_4_);
  fVar18 = (float)uVar1 * 0.0 * 0.0 - uVar1._4_4_;
  uVar1._4_4_ = uVar1._4_4_ * 0.0;
  fVar8 = uVar1._4_4_ * 0.0 + (float)uVar1;
  fVar5 = (float)uVar1 * 0.0 + uVar1._4_4_;
  uVar1._4_4_ = (float)uVar1 * -0.0 + uVar1._4_4_;
  uVar1._0_4_ = fVar8 * 0.0;
  fVar14 = fVar18 + (float)uVar1 + 0.0;
  fVar18 = fVar18 * 0.0;
  fVar13 = fVar8 + fVar18 + 0.0;
  fVar15 = uVar1._4_4_ * 0.0;
  fVar8 = fVar5 * 0.0;
  fVar9 = fVar8 + fVar15;
  fVar16 = local_7c * fVar13;
  fVar17 = fVar14 * local_78;
  fVar18 = fVar18 + (float)uVar1 + 0.0;
  local_58 = ZEXT416((uint)(fVar18 * (float)local_68._0_4_ + fVar14 * local_70 + fVar13 * local_74 +
                           fVar18 * 0.0));
  fVar13 = fVar5 + fVar15 + 0.0;
  fVar14 = uVar1._4_4_ + fVar8 + 0.0;
  uVar1._4_4_ = fVar9 + 1.0;
  uVar1._0_4_ = (fVar9 + 0.0) * 0.0;
  fVar8 = fVar6 * uVar1._4_4_ + local_78 * fVar13 + local_7c * fVar14 + (float)uVar1;
  fVar5 = uVar1._4_4_ * (float)local_68._0_4_ + fVar13 * local_70 + fVar14 * local_74 + (float)uVar1
  ;
  uVar1._0_4_ = atan2f(-(local_38 * uVar1._4_4_ + (float)local_48 * fVar13 + local_6c * fVar14 +
                        (float)uVar1),SQRT(fVar5 * fVar5 + fVar8 * fVar8));
  rot->y = -(float)uVar1;
  fVar6 = atan2f(-(float)local_58._0_4_,fVar18 * fVar6 + fVar17 + fVar16 + fVar18 * 0.0);
  rot->z = -fVar6;
  return;
}

Assistant:

void
extractEulerZYX (const Matrix44<T>& mat, Vec3<T>& rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize ();
    j.normalize ();
    k.normalize ();

    Matrix44<T> M (
        i[0],
        i[1],
        i[2],
        0,
        j[0],
        j[1],
        j[2],
        0,
        k[0],
        k[1],
        k[2],
        0,
        0,
        0,
        0,
        1);

    //
    // Extract the first angle, rot.x.
    //

    rot.x = -std::atan2 (M[1][0], M[0][0]);

    //
    // Remove the x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (0, 0, -rot.x));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy  = std::sqrt (N[2][2] * N[2][2] + N[2][1] * N[2][1]);
    rot.y = -std::atan2 (-N[2][0], cy);
    rot.z = -std::atan2 (-N[1][2], N[1][1]);
}